

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::ub::UniformBufferManager::~UniformBufferManager(UniformBufferManager *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_type sVar4;
  reference pvVar5;
  UniformBufferManager *this_local;
  
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->m_buffers);
  if (!bVar2) {
    iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    pcVar1 = *(code **)(CONCAT44(extraout_var,iVar3) + 0x438);
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_buffers);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_buffers,0);
    (*pcVar1)(sVar4 & 0xffffffff,pvVar5);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->m_buffers);
  return;
}

Assistant:

UniformBufferManager::~UniformBufferManager (void)
{
	if (!m_buffers.empty())
		m_renderCtx.getFunctions().deleteBuffers((glw::GLsizei)m_buffers.size(), &m_buffers[0]);
}